

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize
                 ,U64 pledgedSrcSize)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong maxChunkSize;
  
  maxChunkSize = 1L << ((byte)cParams->windowLog & 0x3f);
  if (pledgedSrcSize <= maxChunkSize) {
    maxChunkSize = pledgedSrcSize;
  }
  if (0x1ffff < maxChunkSize) {
    maxChunkSize = 0x20000;
  }
  if (pledgedSrcSize == 0) {
    maxChunkSize = 1;
  }
  uVar1 = (maxChunkSize & 0xffffffff) / (ulong)((cParams->minMatch != 3) + 3);
  sVar2 = ZSTD_sizeof_matchState(cParams,useRowMatchFinder,0,1);
  sVar3 = ZSTD_ldm_getTableSize(*ldmParams);
  sVar4 = ZSTD_ldm_getMaxNbSeq(*ldmParams,maxChunkSize);
  uVar6 = 0;
  if (ldmParams->enableLdm != 0) {
    uVar6 = sVar4 * 0xc + 0x3f & 0xffffffffffffffc0;
  }
  lVar5 = buffInSize + 0x3db8;
  if (isStatic != 0) {
    lVar5 = buffInSize + 0x4bb0;
  }
  return sVar2 + buffOutSize + lVar5 + maxChunkSize + uVar1 * 3 +
         (ulong)((int)uVar1 * 8 + 0x3fU & 0x3fffc0) + sVar3 + uVar6 + 0x20;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize)
{
    size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << cParams->windowLog), pledgedSrcSize));
    size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
    U32    const divider = (cParams->minMatch==3) ? 3 : 4;
    size_t const maxNbSeq = blockSize / divider;
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}